

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O2

int __thiscall
UnifiedRegex::JumpIfNotCharInst::Print
          (JumpIfNotCharInst *this,DebugWriter *w,Label label,Char *litbuf)

{
  undefined4 in_register_00000014;
  char16 *litbuf_00;
  char16 *litbuf_01;
  Inst *inst;
  DebugWriter *this_00;
  
  DebugWriter::Print(w,L"L%04x: ",CONCAT44(in_register_00000014,label));
  if (DAT_0145949d == '\x01') {
    DebugWriter::Print(w,L"(0x%03x bytes) ",7);
  }
  DebugWriter::Print(w,L"JumpIfNotChar");
  DebugWriter::Print(w,L"(");
  CharMixin::Print(&this->super_CharMixin,w,litbuf_00);
  DebugWriter::Print(w,L", ");
  JumpMixin::Print(&this->super_JumpMixin,w,litbuf_01);
  DebugWriter::PrintEOL(w,L")");
  if (DAT_0145949d == '\x01') {
    this_00 = w;
    DebugWriter::Indent(w);
    Inst::PrintBytes<UnifiedRegex::Inst>((Inst *)this_00,w,inst,&this->super_Inst,L"Inst");
    Inst::PrintBytes<UnifiedRegex::CharMixin>
              (&this->super_Inst,w,&this->super_Inst,&this->super_CharMixin,L"CharMixin");
    Inst::PrintBytes<UnifiedRegex::JumpMixin>
              (&this->super_Inst,w,&this->super_Inst,&this->super_JumpMixin,L"JumpMixin");
    DebugWriter::Unindent(w);
  }
  return 7;
}

Assistant:

int JumpIfNotCharInst::Print(DebugWriter* w, Label label, const Char* litbuf) const
    {
        PRINT_RE_BYTECODE_BEGIN("JumpIfNotChar");
        PRINT_MIXIN_COMMA(CharMixin);
        PRINT_MIXIN(JumpMixin);
        PRINT_RE_BYTECODE_MID();
        PRINT_BYTES(CharMixin);
        PRINT_BYTES(JumpMixin);
        PRINT_RE_BYTECODE_END();
    }